

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int tonumeral(expdesc *e,TValue *v)

{
  lu_byte lVar1;
  int iVar2;
  
  iVar2 = 0;
  if (e->t == e->f) {
    if (e->k == VKFLT) {
      lVar1 = '\x13';
    }
    else {
      if (e->k != VKINT) {
        return 0;
      }
      lVar1 = '\x03';
    }
    if (v != (TValue *)0x0) {
      v->value_ = *(Value *)&e->u;
      v->tt_ = lVar1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int tonumeral (const expdesc *e, TValue *v) {
  if (hasjumps(e))
    return 0;  /* not a numeral */
  switch (e->k) {
    case VKINT:
      if (v) setivalue(v, e->u.ival);
      return 1;
    case VKFLT:
      if (v) setfltvalue(v, e->u.nval);
      return 1;
    default: return 0;
  }
}